

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::detail::MultipartFormDataParser::start_with
          (MultipartFormDataParser *this,string *a,size_t spos,size_t epos,string *b)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong local_40;
  size_t i;
  string *b_local;
  size_t epos_local;
  size_t spos_local;
  string *a_local;
  MultipartFormDataParser *this_local;
  
  uVar2 = std::__cxx11::string::size();
  if (epos - spos < uVar2) {
    this_local._7_1_ = false;
  }
  else {
    for (local_40 = 0; uVar2 = std::__cxx11::string::size(), local_40 < uVar2;
        local_40 = local_40 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)a);
      cVar1 = *pcVar3;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)b);
      if (cVar1 != *pcVar3) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool start_with(const std::string &a, size_t spos, size_t epos,
                  const std::string &b) const {
    if (epos - spos < b.size()) { return false; }
    for (size_t i = 0; i < b.size(); i++) {
      if (a[i + spos] != b[i]) { return false; }
    }
    return true;
  }